

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  char zBase [70];
  StrAccum local_80;
  char local_58 [72];
  
  local_80.mxAlloc = db->aLimit[0];
  local_80.zBase = local_58;
  local_80.nChar = 0;
  local_80.nAlloc = 0x46;
  local_80.tooBig = '\0';
  local_80.mallocFailed = '\0';
  local_80.useMalloc = '\x01';
  local_80.db = db;
  local_80.zText = local_80.zBase;
  sqlite3VXPrintf(&local_80,1,zFormat,ap);
  pcVar1 = sqlite3StrAccumFinish(&local_80);
  if (local_80.mallocFailed != '\0') {
    db->mallocFailed = '\x01';
  }
  return pcVar1;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.db = db;
  sqlite3VXPrintf(&acc, 1, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.mallocFailed ){
    db->mallocFailed = 1;
  }
  return z;
}